

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::POMDPX::ApproxInitialParticleSet
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          POMDPX *this)

{
  double random;
  int iVar1;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  bool bVar5;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,
                               "[POMDPX::ApproximatePrior] Drawing 1000 random particles from initial belief."
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  iVar1 = 1000;
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    random = Random::NextDouble((Random *)&Random::RANDOM);
    iVar2 = (*(this->super_MDP)._vptr_MDP[0x19])(0xd2f1a9fc,this,0xffffffff);
    Parser::ComputeState((vector<int,_std::allocator<int>_> *)&local_48,this->parser_,random);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)((pointer)CONCAT44(extraout_var,iVar2) + 8),
               &local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
               (State **)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> POMDPX::ApproxInitialParticleSet() const {
	vector<State*> particles;

	logi
		<< "[POMDPX::ApproximatePrior] Drawing 1000 random particles from initial belief."
		<< endl;
	for (int i = 0; i < 1000; i++) {
		double random_value = Random::RANDOM.NextDouble();
		POMDPXState* state = static_cast<POMDPXState*>(Allocate(-1, 0.001));
		state->vec_id = parser_->ComputeState(random_value);
		particles.push_back(state);
	}

	return particles;
}